

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

void xmlMutexLock(xmlMutexPtr tok)

{
  xmlMutexPtr tok_local;
  
  if ((tok != (xmlMutexPtr)0x0) && (libxml_is_threaded != 0)) {
    pthread_mutex_lock((pthread_mutex_t *)tok);
  }
  return;
}

Assistant:

void
xmlMutexLock(xmlMutexPtr tok)
{
    if (tok == NULL)
        return;
#ifdef HAVE_POSIX_THREADS
    if (libxml_is_threaded != 0)
        pthread_mutex_lock(&tok->lock);
#elif defined HAVE_WIN32_THREADS
    EnterCriticalSection(&tok->cs);
#endif

}